

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

bool __thiscall slang::ast::Type::isBitstreamCastable(Type *this,Type *rhs)

{
  bool bVar1;
  Type *this_00;
  uint64_t uVar2;
  uint64_t uVar3;
  Type *r;
  Type *l;
  bool in_stack_00000037;
  Type *in_stack_00000038;
  Type *in_stack_00000040;
  Type *in_stack_00000048;
  Type *in_stack_ffffffffffffffd0;
  bool local_1;
  
  getCanonicalType(in_stack_ffffffffffffffd0);
  this_00 = getCanonicalType(in_stack_ffffffffffffffd0);
  bVar1 = isBitstreamType(in_stack_00000038,in_stack_00000037);
  if ((bVar1) && (bVar1 = isBitstreamType(in_stack_00000038,in_stack_00000037), bVar1)) {
    bVar1 = isFixedSize(l);
    if ((bVar1) && (bVar1 = isFixedSize(l), bVar1)) {
      uVar2 = getBitstreamWidth(this_00);
      uVar3 = getBitstreamWidth(this_00);
      local_1 = uVar2 == uVar3;
    }
    else {
      local_1 = Bitstream::dynamicSizesMatch<slang::ast::Type,slang::ast::Type>
                          (in_stack_00000048,in_stack_00000040);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Type::isBitstreamCastable(const Type& rhs) const {
    const Type* l = &getCanonicalType();
    const Type* r = &rhs.getCanonicalType();
    if (l->isBitstreamType(true) && r->isBitstreamType()) {
        if (l->isFixedSize() && r->isFixedSize())
            return l->getBitstreamWidth() == r->getBitstreamWidth();
        else
            return Bitstream::dynamicSizesMatch(*l, *r);
    }
    return false;
}